

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O0

void __thiscall
cmDependsFortranParser_s::cmDependsFortranParser_s
          (cmDependsFortranParser_s *this,cmDependsFortran *self,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *ppDefines,cmDependsFortranSourceInfo *info)

{
  YY_BUFFER_STATE_conflict new_buffer;
  YY_BUFFER_STATE buffer;
  cmDependsFortranSourceInfo *info_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ppDefines_local;
  cmDependsFortran *self_local;
  cmDependsFortranParser_s *this_local;
  
  this->Self = self;
  std::
  stack<cmDependsFortranFile,std::deque<cmDependsFortranFile,std::allocator<cmDependsFortranFile>>>
  ::stack<std::deque<cmDependsFortranFile,std::allocator<cmDependsFortranFile>>,void>
            ((stack<cmDependsFortranFile,std::deque<cmDependsFortranFile,std::allocator<cmDependsFortranFile>>>
              *)&this->FileStack);
  std::__cxx11::string::string((string *)&this->TokenString);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->PPDefinitions,ppDefines);
  std::stack<bool,std::deque<bool,std::allocator<bool>>>::
  stack<std::deque<bool,std::allocator<bool>>,void>
            ((stack<bool,std::deque<bool,std::allocator<bool>>> *)&this->SkipToEnd);
  this->Info = info;
  this->InInterface = false;
  this->InPPFalseBranch = 0;
  cmDependsFortran_yylex_init(&this->Scanner);
  cmDependsFortran_yyset_extra((cmListFileLexer *)this,this->Scanner);
  new_buffer = cmDependsFortran_yy_create_buffer((FILE *)0x0,4,this->Scanner);
  cmDependsFortran_yy_switch_to_buffer(new_buffer,this->Scanner);
  return;
}

Assistant:

cmDependsFortranParser_s
::cmDependsFortranParser_s(cmDependsFortran* self,
                           std::set<std::string>& ppDefines,
                           cmDependsFortranSourceInfo& info):
  Self(self), PPDefinitions(ppDefines), Info(info)
{
  this->InInterface = 0;
  this->InPPFalseBranch = 0;

  // Initialize the lexical scanner.
  cmDependsFortran_yylex_init(&this->Scanner);
  cmDependsFortran_yyset_extra(this, this->Scanner);

  // Create a dummy buffer that is never read but is the fallback
  // buffer when the last file is popped off the stack.
  YY_BUFFER_STATE buffer =
    cmDependsFortran_yy_create_buffer(0, 4, this->Scanner);
  cmDependsFortran_yy_switch_to_buffer(buffer, this->Scanner);
}